

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationUtil.cpp
# Opt level: O1

int vkt::tessellation::referenceQuadNonPointModePrimitiveCount
              (SpacingMode spacingMode,int inner0,int inner1,int outer0,int outer1,int outer2,
              int outer3)

{
  uint uVar1;
  
  while( true ) {
    if (inner0 != 1 && inner1 != 1) {
      return outer3 + outer0 + inner1 * 2 + outer1 + outer2 + (inner1 - 1U) * (inner0 * 2 + -4) + -4
      ;
    }
    if ((((inner0 == 1) && (inner1 == 1)) && (outer0 == 1)) &&
       (((outer1 == 1 && (outer2 == 1)) && (outer3 == 1)))) break;
    uVar1 = spacingMode == SPACINGMODE_FRACTIONAL_ODD | 2;
    if (inner0 < 2) {
      inner0 = uVar1;
    }
    if (inner1 < 2) {
      inner1 = uVar1;
    }
  }
  return 2;
}

Assistant:

static int referenceQuadNonPointModePrimitiveCount (const SpacingMode spacingMode, const int inner0, const int inner1, const int outer0, const int outer1, const int outer2, const int outer3)
{
	if (inner0 == 1 || inner1 == 1)
	{
		if (inner0 == 1 && inner1 == 1 && outer0 == 1 && outer1 == 1 && outer2 == 1 && outer3 == 1)
			return 2;
		else
			return referenceQuadNonPointModePrimitiveCount(spacingMode, inner0 > 1 ? inner0 : spacingMode == SPACINGMODE_FRACTIONAL_ODD ? 3 : 2,
																		inner1 > 1 ? inner1 : spacingMode == SPACINGMODE_FRACTIONAL_ODD ? 3 : 2,
																		outer0, outer1, outer2, outer3);
	}
	else
		return 2*(inner0-2)*(inner1-2) + 2*(inner0-2) + 2*(inner1-2) + outer0+outer1+outer2+outer3;
}